

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VehicleState.cc
# Opt level: O2

void __thiscall
VehicleState::Propagator::operator()(Propagator *this,state_type *x,state_type *dxdt,double t)

{
  double mu;
  double J2;
  double Rearth;
  double J3;
  double wEarth;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  pointer pdVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  long lVar11;
  long lVar12;
  int ii;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar18;
  ResScalar RVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  undefined1 auVar28 [16];
  double dVar16;
  double dVar17;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  double local_378;
  Vector3d accelinit;
  double local_2a8;
  double dStack_2a0;
  double local_298;
  Vector3d r_sun_ECI;
  state_type accel;
  state_type pos;
  Vector3d r_craft2sun;
  MatrixXd dSTM;
  Vector3d r_craft2sun_norm;
  VectorXd eigcol;
  MatrixXd STM;
  Vector3d r_craft2moon;
  state_type vel;
  MatrixXd jac;
  Vector3d r_moon_ECI;
  Vector3d eigvel;
  _Vector_base<double,_std::allocator<double>_> local_a0;
  Vector3d local_88;
  Vector3d local_68;
  Vector3d local_48;
  
  mu = this->mu_;
  J2 = this->J2_;
  Rearth = this->Rearth_;
  J3 = this->J3_;
  pdVar8 = (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  accelinit.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       *pdVar8;
  accelinit.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       pdVar8[1];
  accelinit.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       pdVar8[2];
  __l._M_len = 3;
  __l._M_array = (iterator)&accelinit;
  std::vector<double,_std::allocator<double>_>::vector(&pos,__l,(allocator_type *)&vel);
  pdVar8 = (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  accelinit.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       pdVar8[3];
  accelinit.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       pdVar8[4];
  accelinit.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       pdVar8[5];
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)&accelinit;
  std::vector<double,_std::allocator<double>_>::vector(&vel,__l_00,(allocator_type *)&r_sun_ECI);
  wEarth = this->earthrotationspeed_;
  dVar1 = this->C_D_;
  dVar2 = this->A_;
  dVar3 = this->m_;
  dVar4 = this->rho_0_;
  dVar27 = this->r0_;
  dVar5 = this->H_;
  dVar6 = this->AU_;
  dVar35 = this->mu_sun_;
  dVar13 = t / 86400.0 + this->t_JD_;
  dVar7 = this->mu_moon_;
  pdVar8 = (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  local_2a8 = *pdVar8;
  dStack_2a0 = pdVar8[1];
  local_298 = pdVar8[2];
  dVar14 = *pos.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start;
  dVar15 = pos.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start[1];
  dVar16 = pos.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start[2];
  accelinit.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       0.0;
  accelinit.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       0.0;
  accelinit.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       0.0;
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)&accelinit;
  std::vector<double,_std::allocator<double>_>::vector
            (&accel,__l_01,(allocator_type *)&r_craft2sun_norm);
  dVar14 = SQRT(dVar16 * dVar16 + dVar15 * dVar15 + dVar14 * dVar14);
  if (this->use20x20_ == true) {
    local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = local_298;
    local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = local_2a8;
    local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = dStack_2a0;
    Util::EGM96Grav::GetGravAccel(&accelinit,this->gravmodel_,&local_48,dVar13);
    *accel.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_start = *accel.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start +
                accelinit.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[0];
    accel.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[1] = accel.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[1] +
                  accelinit.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[1];
    dVar15 = accel.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[2] +
             accelinit.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
             .array[2];
LAB_00110543:
    accel.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[2] = dVar15;
  }
  else {
    local_378 = -mu;
    dVar15 = pow(dVar14,3.0);
    local_378 = local_378 / dVar15;
    *accel.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_start = *pos.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start * local_378 +
                *accel.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
    accel.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[1] = pos.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[1] * local_378 +
                  accel.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[1];
    accel.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[2] = local_378 *
                  pos.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[2] +
                  accel.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[2];
    if (this->useJ2_ == true) {
      dVar36 = *pos.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      dVar34 = pos.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[1] *
               pos.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[1];
      dVar17 = pos.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[2] *
               pos.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[2];
      dVar37 = Rearth * Rearth * J2 * mu;
      dVar33 = dVar36 * dVar36 + dVar34;
      dVar18 = dVar17 * -4.0 + dVar33;
      dVar33 = dVar33 + dVar17;
      dVar31 = pow(dVar33,3.5);
      dVar15 = pos.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[1];
      dVar32 = pow(dVar33,3.5);
      dVar16 = pos.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[2];
      dVar33 = pow(dVar33,3.5);
      auVar28._0_8_ = dVar18 * dVar37 * dVar36;
      auVar28._8_8_ = dVar18 * dVar37 * dVar15;
      auVar30._8_8_ = dVar32;
      auVar30._0_8_ = dVar31;
      auVar30 = divpd(auVar28,auVar30);
      *accel.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start = *accel.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start + auVar30._0_8_ * -1.5;
      accel.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[1] = accel.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[1] + auVar30._8_8_ * -1.5;
      dVar15 = accel.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[2] -
               ((dVar36 * dVar36 * 3.0 + dVar34 * 3.0) - (dVar17 + dVar17)) *
               ((dVar16 * dVar37) / dVar33) * 1.5;
      goto LAB_00110543;
    }
  }
  if (this->usedrag_ == true) {
    dVar15 = vel.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
             ._M_start[2];
    dVar36 = wEarth * pos.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[1] +
             *vel.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    dVar37 = -wEarth * *pos.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start +
             vel.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
             ._M_start[1];
    dVar16 = exp(-(dVar14 - dVar27) / dVar5);
    dVar17 = dVar16 * dVar4 * dVar1 * 500.0 * dVar2 *
             SQRT(dVar37 * dVar37 + dVar36 * dVar36 + dVar15 * dVar15);
    auVar29._0_8_ = dVar17 * dVar36;
    auVar29._8_8_ = dVar17 * dVar37;
    auVar10._8_8_ = dVar3;
    auVar10._0_8_ = dVar3;
    auVar30 = divpd(auVar29,auVar10);
    dVar16 = accel.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[1] - auVar30._8_8_;
    auVar9._8_4_ = SUB84(dVar16,0);
    auVar9._0_8_ = *accel.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start - auVar30._0_8_;
    auVar9._12_4_ = (int)((ulong)dVar16 >> 0x20);
    *(undefined1 (*) [16])
     accel.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_start = auVar9;
    accel.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[2] = accel.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[2] - (dVar15 * dVar17) / dVar3;
  }
  dVar16 = (dVar13 + -2451545.0) / 36525.0;
  dVar15 = dVar16 * 35999.050957 + 357.528;
  dVar13 = sin(dVar15 * 0.017453292519943295);
  dVar17 = (dVar15 + dVar15) * 0.017453292519943295;
  dVar36 = sin(dVar17);
  dVar15 = cos(dVar15 * 0.017453292519943295);
  dVar17 = cos(dVar17);
  dVar15 = dVar17 * -0.000139589 + dVar15 * -0.016708617 + 1.000140612;
  dVar17 = dVar16 * -0.0130042 + 23.439291;
  dVar13 = (dVar36 * 0.019994643 + dVar13 * 1.914666471 + dVar16 * 36000.771285 + 280.46) *
           0.017453292519943295;
  dVar36 = cos(dVar13);
  r_sun_ECI.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       dVar36 * dVar15 * dVar6;
  dVar36 = dVar17 * 0.017453292519943295;
  dVar37 = cos(dVar36);
  dVar18 = sin(dVar13);
  r_sun_ECI.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       dVar37 * dVar15 * dVar18 * dVar6;
  dVar36 = sin(dVar36);
  dVar13 = sin(dVar13);
  r_sun_ECI.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       dVar36 * dVar15 * dVar13 * dVar6;
  accelinit.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (double)&r_sun_ECI;
  accelinit.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (double)&local_2a8;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            (&r_craft2sun,
             (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
              *)&accelinit);
  if (this->useSRP_ == true) {
    RVar19 = Eigen::internal::
             dot_nocheck<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false>
             ::run((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&r_sun_ECI,
                   (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_2a8);
    if (RVar19 < 0.0) {
      dVar13 = acos(-RVar19 / (SQRT(r_sun_ECI.
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                    m_storage.m_data.array[2] *
                                    r_sun_ECI.
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                    m_storage.m_data.array[2] +
                                    r_sun_ECI.
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                    m_storage.m_data.array[1] *
                                    r_sun_ECI.
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                    m_storage.m_data.array[1] +
                                    r_sun_ECI.
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                    m_storage.m_data.array[0] *
                                    r_sun_ECI.
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                    m_storage.m_data.array[0]) *
                              SQRT(local_298 * local_298 +
                                   dStack_2a0 * dStack_2a0 + local_2a8 * local_2a8)));
      dVar37 = local_2a8 * local_2a8;
      dVar33 = dStack_2a0 * dStack_2a0;
      dVar18 = local_298 * local_298;
      dVar36 = cos(dVar13);
      dVar31 = local_2a8 * local_2a8;
      dVar34 = dStack_2a0 * dStack_2a0;
      dVar32 = local_298 * local_298;
      dVar13 = sin(dVar13);
      if (dVar13 * SQRT(dVar32 + dVar34 + dVar31) <=
          (Rearth / 0.0046950441895121445 + dVar36 * SQRT(dVar18 + dVar33 + dVar37)) *
          0.004695095937829986) goto LAB_00110a74;
    }
    accelinit.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = SQRT(r_craft2sun.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[2] *
                r_craft2sun.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[2] +
                r_craft2sun.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[1] *
                r_craft2sun.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[1] +
                r_craft2sun.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[0] *
                r_craft2sun.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[0]);
    accelinit.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = (double)&r_craft2sun;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&r_craft2sun_norm,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                *)&accelinit);
    dVar13 = dVar3 * 1000.0;
    *accel.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_start = *accel.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start -
                (r_craft2sun_norm.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                 m_storage.m_data.array[0] * 0.00012339) / dVar13;
    accel.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[1] = accel.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[1] -
                  (r_craft2sun_norm.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                   m_storage.m_data.array[1] * 0.00012339) / dVar13;
    accel.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[2] = accel.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[2] -
                  (r_craft2sun_norm.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                   m_storage.m_data.array[2] * 0.00012339) / dVar13;
  }
LAB_00110a74:
  if (this->useLuniSolar_ == true) {
    dVar13 = (dVar16 * 477198.85 + 134.9) * 0.017453292519943295;
    dVar36 = sin(dVar13);
    dVar37 = (dVar16 * -413335.38 + 259.2) * 0.017453292519943295;
    dVar18 = sin(dVar37);
    dVar31 = sin((dVar16 * 890543.23 + 235.7) * 0.017453292519943295);
    dVar32 = (dVar16 * 954397.7 + 269.9) * 0.017453292519943295;
    dVar33 = sin(dVar32);
    dVar34 = sin((dVar16 * 35999.05 + 357.5) * 0.017453292519943295);
    dVar20 = sin(dVar16 * 966404.05 + 186.6);
    dVar21 = sin((dVar16 * 483202.03 + 93.3) * 0.017453292519943295);
    dVar22 = sin((dVar16 * 960400.87 + 228.2) * 0.017453292519943295);
    dVar23 = sin((dVar16 * 6003.18 + 318.3) * 0.017453292519943295);
    dVar24 = sin((dVar16 * -407332.2 + 217.6) * 0.017453292519943295);
    dVar13 = cos(dVar13);
    dVar37 = cos(dVar37);
    dVar25 = cos((dVar16 * 890534.23 + 235.7) * 0.017453292519943295);
    dVar32 = cos(dVar32);
    dVar26 = pow(dVar16,3.0);
    dVar13 = sin((dVar32 * 0.0028 + dVar25 * 0.0078 + dVar37 * 0.0095 + dVar13 * 0.0518 + 0.9508) *
                 0.017453292519943295);
    dVar13 = Rearth / dVar13;
    dVar37 = (dVar24 * -0.17 + dVar23 * -0.28 + dVar22 * 0.28 + dVar21 * 5.13) *
             0.017453292519943295;
    dVar32 = cos(dVar37);
    dVar36 = (dVar20 * -0.11 +
             dVar34 * -0.19 +
             dVar33 * 0.21 +
             dVar31 * 0.66 + dVar18 * -1.27 + dVar36 * 6.29 + dVar16 * 481267.8813 + 218.32) *
             0.017453292519943295;
    dVar18 = cos(dVar36);
    r_moon_ECI.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
    [0] = dVar32 * dVar13 * dVar18;
    dVar16 = (dVar26 * 5.04e-07 + dVar16 * dVar16 * -1.6399999999999999e-07 + dVar17) *
             0.017453292519943295;
    dVar17 = cos(dVar16);
    dVar18 = cos(dVar37);
    dVar31 = sin(dVar36);
    dVar32 = sin(dVar16);
    dVar33 = sin(dVar37);
    r_moon_ECI.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
    [1] = (dVar18 * dVar17 * dVar31 - dVar33 * dVar32) * dVar13;
    dVar17 = sin(dVar16);
    dVar18 = cos(dVar37);
    dVar36 = sin(dVar36);
    dVar16 = cos(dVar16);
    dVar37 = sin(dVar37);
    r_moon_ECI.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
    [2] = (dVar18 * dVar17 * dVar36 + dVar37 * dVar16) * dVar13;
    accelinit.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = (double)&r_moon_ECI;
    accelinit.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = (double)&local_2a8;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
              (&r_craft2moon,
               (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                *)&accelinit);
    dVar16 = pow(SQRT(r_craft2sun.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array[2] *
                      r_craft2sun.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array[2] +
                      r_craft2sun.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array[1] *
                      r_craft2sun.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array[1] +
                      r_craft2sun.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array[0] *
                      r_craft2sun.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array[0]),3.0);
    dVar15 = pow(dVar6 * dVar15,3.0);
    dVar17 = pow(SQRT(r_craft2moon.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array[2] *
                      r_craft2moon.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array[2] +
                      r_craft2moon.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array[1] *
                      r_craft2moon.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array[1] +
                      r_craft2moon.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array[0] *
                      r_craft2moon.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array[0]),3.0);
    dVar13 = pow(dVar13,3.0);
    dVar6 = (r_craft2sun.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
             m_data.array[0] / dVar16 -
            r_sun_ECI.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[0] / dVar15) * dVar35 +
            *accel.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    *accel.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_start = dVar6;
    dVar36 = (r_craft2sun.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[1] / dVar16 -
             r_sun_ECI.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
             .array[1] / dVar15) * dVar35 +
             accel.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[1];
    accel.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[1] = dVar36;
    dVar35 = (r_craft2sun.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[2] / dVar16 -
             r_sun_ECI.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
             .array[2] / dVar15) * dVar35 +
             accel.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[2];
    accel.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[2] = dVar35;
    *accel.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_start = (r_craft2moon.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                 .m_data.array[0] / dVar17 -
                r_moon_ECI.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[0] / dVar13) * dVar7 + dVar6;
    accel.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[1] = (r_craft2moon.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                   m_storage.m_data.array[1] / dVar17 -
                  r_moon_ECI.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[1] / dVar13) * dVar7 + dVar36;
    accel.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[2] = (r_craft2moon.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                   m_storage.m_data.array[2] / dVar17 -
                  r_moon_ECI.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[2] / dVar13) * dVar7 + dVar35;
  }
  if (this->intSTM_ == true) {
    dVar27 = exp(-(dVar14 - dVar27) / dVar5);
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::_init1<double*>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&r_craft2sun_norm,
               pos.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start);
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::_init1<double*>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&eigvel,
               vel.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start);
    local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = r_craft2sun_norm.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
           m_data.array[0];
    local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = r_craft2sun_norm.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
           m_data.array[1];
    local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = r_craft2sun_norm.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
           m_data.array[2];
    local_88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = eigvel.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[0];
    local_88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = eigvel.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1];
    local_88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = eigvel.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[2];
    Util::GetGravJac(&jac,&local_68,&local_88,Rearth,wEarth,mu,J2,J3,
                     (dVar1 * 500000.0 * dVar2 * dVar4 * dVar27) / dVar3);
    accelinit.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = 2.96439387504748e-323;
    accelinit.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = 2.96439387504748e-323;
    accelinit.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = 0.0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&STM,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                *)&accelinit);
    lVar12 = 0x30;
    for (lVar11 = 0; lVar11 != 6; lVar11 = lVar11 + 1) {
      accelinit.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [0] = 0.0;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&dSTM,6,
                 (value_type_conflict1 *)&accelinit,(allocator_type *)&eigcol);
      pdVar8 = (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      *dSTM.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           *(double *)((long)pdVar8 + lVar12);
      dSTM.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data[1] =
           *(double *)((long)pdVar8 + lVar12 + 8);
      dSTM.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data[2] =
           *(double *)((long)pdVar8 + lVar12 + 0x10);
      dSTM.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data[3] =
           *(double *)((long)pdVar8 + lVar12 + 0x18);
      dSTM.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data[4] =
           *(double *)((long)pdVar8 + lVar12 + 0x20);
      dSTM.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data[5] =
           *(double *)((long)pdVar8 + lVar12 + 0x28);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_a0,
                 (vector<double,_std::allocator<double>_> *)&dSTM);
      Util::StdVec2Eigen((Util *)&eigcol,(vector<double,_std::allocator<double>_> *)&local_a0);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_a0);
      accelinit.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [0] = (double)(STM.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                     m_data + STM.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                              m_storage.m_rows * lVar11);
      accelinit.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [1] = 2.96439387504748e-323;
      accelinit.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [2] = 4.94065645841247e-324;
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::Matrix<double,_1,1,0,_1,1>>
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)&accelinit,
                 (Matrix<double,__1,_1,_0,__1,_1> *)&eigcol);
      free(eigcol.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&dSTM);
      lVar12 = lVar12 + 0x30;
    }
    accelinit.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = (double)&jac;
    accelinit.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = (double)&STM;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&dSTM,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                *)&accelinit);
    lVar12 = 0x30;
    for (lVar11 = 0; lVar11 != 6; lVar11 = lVar11 + 1) {
      accelinit.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [0] = (double)(dSTM.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                     .m_data +
                    dSTM.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                    m_rows * lVar11);
      accelinit.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [1] = 2.96439387504748e-323;
      accelinit.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [2] = 4.94065645841247e-324;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&eigcol,
                 (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>
                  *)&accelinit);
      pdVar8 = (dxdt->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      *(double *)((long)pdVar8 + lVar12) =
           *eigcol.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      *(double *)((long)pdVar8 + lVar12 + 8) =
           eigcol.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[1]
      ;
      *(double *)((long)pdVar8 + lVar12 + 0x10) =
           eigcol.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[2]
      ;
      *(double *)((long)pdVar8 + lVar12 + 0x18) =
           eigcol.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[3]
      ;
      *(double *)((long)pdVar8 + lVar12 + 0x20) =
           eigcol.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[4]
      ;
      *(double *)((long)pdVar8 + lVar12 + 0x28) =
           eigcol.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[5]
      ;
      free(eigcol.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
      lVar12 = lVar12 + 0x30;
    }
    free(dSTM.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
    free(STM.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
    free(jac.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  }
  pdVar8 = (dxdt->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  *pdVar8 = *vel.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
             ._M_start;
  pdVar8[1] = vel.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[1];
  pdVar8[2] = vel.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[2];
  pdVar8[3] = *accel.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
  pdVar8[4] = accel.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[1];
  pdVar8[5] = accel.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[2];
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&accel.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&vel.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&pos.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void Propagator::operator()  (const state_type &x , state_type &dxdt , const double t){
		
		//extract locals
		double mu = this->mu_;
		double Rearth = this->Rearth_;
		double J2 = this->J2_;
		double J3 = this->J3_;
		state_type pos = {x[0], x[1], x[2]};
		state_type vel = {x[3], x[4], x[5]};
		double earthrot = this->earthrotationspeed_;
		double C_D = this->C_D_; // coefficient of drag
		double A = this->A_; // effective area, m^2
		double m = this->m_; // vehicle mass, kg
		double rho_0 = this->rho_0_; // standard air density, kg/m^3
		double r0 = this->r0_; // param for air density calc, km
		double H = this->H_; //param for air density calc, km
		double t_JD_init = this->t_JD_; //UTC julian date at initialization
		double AU2km = this->AU_;
		double mu_sun = this->mu_sun_;
		double mu_moon = this->mu_moon_;

		//initialize some variables we may need
		Eigen::Vector3d r_sun_ECI; //position of the sun in ECI frame [km]
		Eigen::Vector3d r_craft2sun; //ECI position from craft to sun [km]
		Eigen::Vector3d r_moon_ECI; //position of the moon in ECI frame [km]
		Eigen::Vector3d r_craft2moon; //ECI position from craft to moon [km]
		Eigen::Vector3d r_craft(x[0], x[1], x[2]); //eigen position vector for spacecraft [km]

		//intermediate calcs
		double r2 = pow(pos[0],2.0) + pow(pos[1],2.0) + pow(pos[2],2.0);
		double r = sqrt(r2);
		double JD_UTC = t_JD_init + t/(24.0*60.0*60.0); //current UTC Julian Date in days
		double d2r = M_PI/180.0; //degrees to radians

		// std::cout << "t: " << t << " state: " << x[0] << " " << x[1] << " " << x[2] << " " << x[3] << " " << x[4] << " " << x[5]; 

		//initalize acceleration
		state_type accel = {0.0, 0.0, 0.0};
		
		if(this->use20x20_){

			Eigen::Vector3d accelinit = this->gravmodel_->GetGravAccel(r_craft, JD_UTC);

			accel[0] = accel[0] + accelinit[0];
			accel[1] = accel[1] + accelinit[1];
			accel[2] = accel[2] + accelinit[2];

		} else {

			//two body acceleration
			double k = -mu/pow(r,3);
			accel[0] = accel[0] + k*pos[0];
			accel[1] = accel[1] + k*pos[1];
			accel[2] = accel[2] + k*pos[2];

			if (this->useJ2_) { // J-2 accel
				
				double t2 = pow(pos[0],2);
				double t3 = pow(pos[1],2);
				double t4 = pow(pos[2],2);
				double accel_j2_x = J2*pow(Rearth,2)*mu*pos[0]*(t2+t3-t4*4.0)*1.0/pow(t2+t3+t4,7.0/2.0)*(-3.0/2.0);
				double accel_j2_y = J2*pow(Rearth,2)*mu*pos[1]*(t2+t3-t4*4.0)*1.0/pow(t2+t3+t4,7.0/2.0)*(-3.0/2.0);
				double accel_j2_z = J2*pow(Rearth,2)*mu*pos[2]*1.0/pow(t2+t3+t4,7.0/2.0)*(t2*3.0+t3*3.0-t4*2.0)*(-3.0/2.0);

				// add J2 acceleration
				accel[0] = accel[0] + accel_j2_x;
				accel[1] = accel[1] + accel_j2_y;
				accel[2] = accel[2] + accel_j2_z;
			} // fi

		}	

		if (this->usedrag_) { // drag acceleration 
			
			//relative wind vector
			Eigen::Vector3d V_A;
			V_A[0] = vel[0] + earthrot*pos[1];
			V_A[1] = vel[1] - earthrot*pos[0];
			V_A[2] = vel[2];
			double nV_A = V_A.norm(); //magnitude

			//current air density
			double rho_A = rho_0*exp(-(r - r0)/H);

			//add drag acceleration (extra 1000 for unit conversion)
			accel[0] = accel[0] - 1000.0*0.5*C_D*A*rho_A*nV_A*V_A[0]/m;
			accel[1] = accel[1] - 1000.0*0.5*C_D*A*rho_A*nV_A*V_A[1]/m;
			accel[2] = accel[2] - 1000.0*0.5*C_D*A*rho_A*nV_A*V_A[2]/m;

		} //fi

		//first, find the position of the sun in the ECI frame (vallado algo 29)

		//assume JD_UTC = JD_UT1 (less than 1 second deviation)
		double T_UT1 = (JD_UTC - 2451545.0)/36525.0; // julian centuries
		// double T_UT1 = (2453827.5 - 2451545.0)/36525.0; // vallado numbers for checking
		double lambda_M_sun = 280.460 + 36000.771285*T_UT1; // mean sun longitude [degrees]

		//assume T_TBD = T_UT1
		double M_sun = 357.528 + 35999.050957*T_UT1; // mean sun something [degrees]
		double lambda_ecliptic = lambda_M_sun + 1.914666471*sin(M_sun*d2r) + 0.019994643*sin(2*M_sun*d2r);

		//norm of position to sun [AU]
		double r_sun_ECI_norm = 1.000140612 - 0.016708617*cos(M_sun*d2r) - 0.000139589*cos(2*M_sun*d2r);
		double eps = 23.439291 - 0.0130042*T_UT1; //ecentricity of sun orbit?

		//position of sun
		r_sun_ECI[0] = r_sun_ECI_norm*cos(lambda_ecliptic*d2r)*AU2km;
		r_sun_ECI[1] = r_sun_ECI_norm*cos(eps*d2r)*sin(lambda_ecliptic*d2r)*AU2km;
		r_sun_ECI[2] = r_sun_ECI_norm*sin(eps*d2r)*sin(lambda_ecliptic*d2r)*AU2km;

		//relative direction of sun in ECI frame
		r_craft2sun = r_sun_ECI - r_craft;

		bool in_sun = true; //boolean to track if we are in the sun or not

		if (this->useSRP_) { //SRP acceleration

			//check to see if we are in the earth's shadow (vallado algo 34)
			double sundotcraft = r_sun_ECI.dot(r_craft);
			if (sundotcraft < 0)	{ // if positive we are between sun and earth

				//constants for earth shadow
				double alpha_pen = 0.269007205*d2r;
				
				//find the angle between the two [radians]
				double xi = acos(-1.0*sundotcraft/(r_sun_ECI.norm()*r_craft.norm()));

				//satellite horizontal and vertical position
				double sat_horiz = r_craft.norm()*cos(xi);
				double sat_vert = r_craft.norm()*sin(xi);

				double x = Rearth/sin(alpha_pen);

				double pen_vert = tan(alpha_pen)*(x+sat_horiz);
				if(sat_vert <= pen_vert) {
					in_sun = false; //consider only penumbra
				} //fi

			} //fi

			//if we are in the sun, add the SRP force
			if (in_sun)	{
				
				//approximate Area * C_s
				// double SRPcoeff = 0.04*15.0 + 0.59*7.0;
				double SRPcoeff = 1.8*15.0;

				//vallado srp
				double p_srp = 4.57*pow(10.0,-6.0);

				//normalize
				Eigen::Vector3d r_craft2sun_norm = r_craft2sun/r_craft2sun.norm();

				//add SRP acceleration (extra 1000 for unit conversion)
				accel[0] = accel[0] - SRPcoeff*p_srp*r_craft2sun_norm[0]/(1000.0*m);
				accel[1] = accel[1] - SRPcoeff*p_srp*r_craft2sun_norm[1]/(1000.0*m);
				accel[2] = accel[2] - SRPcoeff*p_srp*r_craft2sun_norm[2]/(1000.0*m);
			}


		} //fi

		if (this->useLuniSolar_) { //gravitational effects of the sun and moon

			//first, find the position of the moon in the ECI frame (vallado algo 31)

			//assume JD_UTC = JD_TBD
			// double T_TBD = (2449470.5 - 2451545.0)/36525.0; // vallado numbers
			double T_TBD = (JD_UTC - 2451545.0)/36525.0; // julian centuries
			
			double lambda_ecliptic = 218.32 + 481267.8813*T_TBD + 6.29*sin(d2r*(134.9 + 477198.85*T_TBD))
				- 1.27*sin(d2r*(259.2 - 413335.38*T_TBD)) + 0.66*sin(d2r*(235.7 + 890543.23*T_TBD))
				+ 0.21*sin(d2r*(269.9+954397.70*T_TBD)) - 0.19*sin(d2r*(357.5 + 35999.05*T_TBD))
				- 0.11*sin(186.6 + 966404.05*T_TBD);

			double phi_ecliptic = 5.13*sin(d2r*(93.3 + 483202.03*T_TBD)) + 0.28*sin(d2r*(228.2 + 960400.87*T_TBD))
				- 0.28*sin(d2r*(318.3 + 6003.18*T_TBD)) - 0.17*sin(d2r*(217.6 - 407332.20*T_TBD));

			double D = 0.9508 + 0.0518*cos(d2r*(134.9 + 477198.85*T_TBD)) + 0.0095*cos(d2r*(259.2 - 413335.38*T_TBD))
				+ 0.0078*cos(d2r*(235.7 + 890534.23*T_TBD)) + 0.0028*cos(d2r*(269.9 + 954397.70*T_TBD));

			double eps = 23.439291 - 0.0130042*T_TBD - 1.64*pow(10.0,-7.0)*pow(T_TBD,2.0) + 5.04*pow(10.0,-7.0)*pow(T_TBD,3.0);

			double r_moon_ECI_norm = Rearth/sin(d2r*D);

			r_moon_ECI[0] = r_moon_ECI_norm*cos(d2r*phi_ecliptic)*cos(d2r*lambda_ecliptic);
			r_moon_ECI[1] = r_moon_ECI_norm*(cos(eps*d2r)*cos(d2r*phi_ecliptic)*sin(d2r*lambda_ecliptic) - sin(d2r*eps)*sin(d2r*phi_ecliptic));
			r_moon_ECI[2] = r_moon_ECI_norm*(sin(eps*d2r)*cos(d2r*phi_ecliptic)*sin(d2r*lambda_ecliptic) + cos(d2r*eps)*sin(d2r*phi_ecliptic));

			//relative direction of moon in ECI frame
			r_craft2moon = r_moon_ECI - r_craft;

			//intermediate calcs
			double r2 = pow(pos[0],2.0) + pow(pos[1],2.0) + pow(pos[2],2.0);
			double r = sqrt(r2);
			double r3craft2sun = pow(r_craft2sun.norm(),3.0);
			double r3earth2sun = pow(AU2km*r_sun_ECI_norm,3.0);
			double r3craft2moon = pow(r_craft2moon.norm(),3.0);
			double r3earth2moon = pow(r_moon_ECI_norm,3.0);

			// std::cout << "\n" << accel[0] << ", " << accel[1] << ", " << accel[2] << "\n";

			//two body acceleration to sun
			accel[0] = accel[0] + mu_sun*(r_craft2sun[0]/r3craft2sun - r_sun_ECI[0]/r3earth2sun);
			accel[1] = accel[1] + mu_sun*(r_craft2sun[1]/r3craft2sun - r_sun_ECI[1]/r3earth2sun);
			accel[2] = accel[2] + mu_sun*(r_craft2sun[2]/r3craft2sun - r_sun_ECI[2]/r3earth2sun);

			// std::cout << "\n" << accel[0] << ", " << accel[1] << ", " << accel[2] << "\n";

			//two body acceleration to moon
			accel[0] = accel[0] + mu_moon*(r_craft2moon[0]/r3craft2moon - r_moon_ECI[0]/r3earth2moon);
			accel[1] = accel[1] + mu_moon*(r_craft2moon[1]/r3craft2moon - r_moon_ECI[1]/r3earth2moon);
			accel[2] = accel[2] + mu_moon*(r_craft2moon[2]/r3craft2moon - r_moon_ECI[2]/r3earth2moon);

			// std::cout << "\n" << accel[0] << ", " << accel[1] << ", " << accel[2] << "\n";
			// exit(0);
			
		}

		//integrate the STM if needed
		if (this->intSTM_) {

			//current air density
			double rho_A = rho_0*exp(-(r - r0)/H);
			double drag_coeff = 1000.0*1000.0*0.5*C_D*A*rho_A/m;

			//get the jacobian
			Eigen::Vector3d eigpos(pos.data());
			Eigen::Vector3d eigvel(vel.data());
			Eigen::MatrixXd jac = Util::GetGravJac(eigpos, eigvel, Rearth, earthrot, mu, J2, J3, drag_coeff);

			//extract the STM
			Eigen::MatrixXd STM = Eigen::MatrixXd::Zero(6,6);

			for (int ii = 0; ii < 6; ++ii) {

				std::vector<double> col(6,0);
				col[0] = x[6*ii + 0 + 6];
				col[1] = x[6*ii + 1 + 6];
				col[2] = x[6*ii + 2 + 6];
				col[3] = x[6*ii + 3 + 6];
				col[4] = x[6*ii + 4 + 6];
				col[5] = x[6*ii + 5 + 6];

				//convert to eigen
				Eigen::VectorXd eigcol = Util::StdVec2Eigen(col);

				//assign
				STM.block(0,ii,6,1) = eigcol;

			} // for


			//change in STM
			Eigen::MatrixXd dSTM = jac*STM;

			//assign
			for (int ii = 0; ii < 6; ++ii) {
				Eigen::VectorXd eigcol = dSTM.block(0,ii,6,1);

				dxdt[6*ii + 0 + 6] = eigcol[0];
				dxdt[6*ii + 1 + 6] = eigcol[1];
				dxdt[6*ii + 2 + 6] = eigcol[2];
				dxdt[6*ii + 3 + 6] = eigcol[3];
				dxdt[6*ii + 4 + 6] = eigcol[4];
				dxdt[6*ii + 5 + 6] = eigcol[5];

			} // for


			
		} //fi


		//change in state
		dxdt[0] = vel[0];
		dxdt[1] = vel[1];
		dxdt[2] = vel[2];
		dxdt[3] = accel[0];
		dxdt[4] = accel[1];
		dxdt[5] = accel[2];

		// std::cout << "simple accel: \n" << accel[0] << "\n" << accel[1] << "\n" << accel[2] << "\n";

		// exit(0);

	}